

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uri.cpp
# Opt level: O2

bool __thiscall Uri::Uri::operator==(Uri *this,Uri *that)

{
  __type _Var1;
  
  _Var1 = std::operator==(&this->scheme,&that->scheme);
  if (_Var1) {
    _Var1 = std::operator==(&this->authority,&that->authority);
    if (_Var1) {
      _Var1 = std::operator==(&this->path,&that->path);
      if (_Var1) {
        _Var1 = std::operator==(&this->query,&that->query);
        if (_Var1) {
          _Var1 = std::operator==(&this->fragment,&that->fragment);
          return _Var1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Uri::operator == (Uri &that) {
    return scheme == that.scheme
           && authority == that.authority
           && path == that.path
           && query == that.query
           && fragment == that.fragment;
}